

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# data_serialization_test.cpp
# Opt level: O0

int main(int argc,char **argv)

{
  initializer_list<unsigned_char> __l;
  byte bVar1;
  _Ios_Openmode _Var2;
  result_type_conflict1 rVar3;
  result_type __n;
  iterator iVar4;
  iterator end;
  size_t sVar5;
  char *pcVar6;
  size_type __nbytes;
  allocator<unsigned_char> *this;
  void *__buf;
  void *__buf_00;
  iterator iStack_2ae8;
  int steps;
  iterator tail;
  iterator head;
  uniform_int_distribution<int> dist;
  mt19937 rgen;
  random_device rdev;
  size_t numBytes;
  undefined1 auStack_3b0 [7];
  uchar chr;
  ifstream binData;
  undefined1 local_1a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> bytes;
  string local_188 [8];
  string file;
  undefined1 local_168 [8];
  ApplicationXimuReader reader;
  allocator<unsigned_char> local_c5;
  uchar local_c4 [12];
  iterator local_b8;
  size_type local_b0;
  undefined1 local_a8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> encodedQuaternion;
  ApplicationXimuReader oneQuaternionReader;
  char **argv_local;
  int argc_local;
  
  ApplicationXimuReader::ApplicationXimuReader
            ((ApplicationXimuReader *)
             &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  builtin_memcpy(local_c4,"\x05\x1fn\x10\x0f0",7);
  local_c4[7] = 10;
  local_c4[8] = 2;
  local_c4[9] = 0x52;
  local_c4[10] = 0x48;
  local_c4[0xb] = 0x80;
  local_b8 = local_c4;
  local_b0 = 0xc;
  this = &local_c5;
  std::allocator<unsigned_char>::allocator(this);
  __l._M_len = local_b0;
  __l._M_array = local_b8;
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8,__l,this);
  std::allocator<unsigned_char>::~allocator(&local_c5);
  iVar4 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  end = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ximu::ReaderBase::
  fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            ((ReaderBase *)
             &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )iVar4._M_current,
             (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
              )end._M_current);
  ximu::ReaderBase::read
            ((ReaderBase *)
             &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage,(int)iVar4._M_current,__buf,
             (size_t)this);
  sVar5 = ApplicationXimuReader::QuaternionCount
                    ((ApplicationXimuReader *)
                     &encodedQuaternion.
                      super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
  if (sVar5 == 1) {
    ApplicationXimuReader::ApplicationXimuReader((ApplicationXimuReader *)local_168);
    std::allocator<char>::allocator();
    std::__cxx11::string::string
              (local_188,"ximu.dmp",
               (allocator *)
               ((long)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::allocator<char>::~allocator
              ((allocator<char> *)
               ((long)&bytes.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                       _M_impl.super__Vector_impl_data._M_end_of_storage + 7));
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    pcVar6 = (char *)std::__cxx11::string::c_str();
    _Var2 = std::operator|(_S_in,_S_bin);
    std::ifstream::ifstream(auStack_3b0,pcVar6,_Var2);
    numBytes._7_1_ = std::istream::get();
    while( true ) {
      bVar1 = std::ios::good();
      if ((bVar1 & 1) == 0) break;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::push_back
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8,
                 (value_type *)((long)&numBytes + 7));
      numBytes._7_1_ = std::istream::get();
    }
    rdev.field_0._M_mt._M_p =
         std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                   ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    std::random_device::random_device((random_device *)&rgen._M_p);
    rVar3 = std::random_device::operator()((random_device *)&rgen._M_p);
    std::
    mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
    ::mersenne_twister_engine
              ((mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                *)&dist,(ulong)rVar3);
    std::uniform_int_distribution<int>::uniform_int_distribution
              ((uniform_int_distribution<int> *)&head,2,100);
    tail = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    iStack_2ae8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::begin
                            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    while (rdev.field_0._M_mt._M_p != 0) {
      __n = std::uniform_int_distribution<int>::operator()
                      ((uniform_int_distribution<int> *)&head,
                       (mersenne_twister_engine<unsigned_long,_32UL,_624UL,_397UL,_31UL,_2567483615UL,_11UL,_4294967295UL,_7UL,_2636928640UL,_15UL,_4022730752UL,_18UL,_1812433253UL>
                        *)&dist);
      __nbytes = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                           ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
      if (rdev.field_0._M_mt._M_p - (long)__n < __nbytes) {
        tail._M_current = iStack_2ae8._M_current;
        std::
        advance<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>,int>
                  (&stack0xffffffffffffd518,__n);
        __nbytes = (size_type)__n;
        rdev.field_0._M_mt._M_p = rdev.field_0._M_mt._M_p - __nbytes;
      }
      else {
        tail._M_current = iStack_2ae8._M_current;
        iStack_2ae8 = std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8)
        ;
        rdev.field_0._M_mt._M_p = 0;
      }
      iVar4._M_current = tail._M_current;
      ximu::ReaderBase::
      fill<__gnu_cxx::__normal_iterator<unsigned_char*,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                ((ReaderBase *)local_168,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )tail._M_current,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  )iStack_2ae8._M_current);
      ximu::ReaderBase::read((ReaderBase *)local_168,(int)iVar4._M_current,__buf_00,__nbytes);
    }
    sVar5 = ApplicationXimuReader::QuaternionCount((ApplicationXimuReader *)local_168);
    if (sVar5 == 0x235) {
      sVar5 = ApplicationXimuReader::CalInertialAndMagneticDataCount
                        ((ApplicationXimuReader *)local_168);
      if (sVar5 == 0x8d4) {
        argv_local._4_4_ = 0;
      }
      else {
        argv_local._4_4_ = 1;
      }
    }
    else {
      argv_local._4_4_ = 1;
    }
    reader._digitalIOCount._4_4_ = 1;
    std::random_device::~random_device((random_device *)&rgen._M_p);
    std::ifstream::~ifstream(auStack_3b0);
    std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_1a8);
    std::__cxx11::string::~string(local_188);
    ApplicationXimuReader::~ApplicationXimuReader((ApplicationXimuReader *)local_168);
  }
  else {
    argv_local._4_4_ = 1;
    reader._digitalIOCount._4_4_ = 1;
  }
  std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
            ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_a8);
  ApplicationXimuReader::~ApplicationXimuReader
            ((ApplicationXimuReader *)
             &encodedQuaternion.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
              _M_impl.super__Vector_impl_data._M_end_of_storage);
  return argv_local._4_4_;
}

Assistant:

int main(int argc, char* argv[]) {

  /*
   * Testing one encoded quaternion
   */
  ApplicationXimuReader oneQuaternionReader;
  std::vector<unsigned char> encodedQuaternion = {5, 31, 110, 16, 15, 48, 0, 10, 2, 82, 72, 128 };
  oneQuaternionReader.fill(encodedQuaternion.begin(),encodedQuaternion.end());
  oneQuaternionReader.read();
  if (oneQuaternionReader.QuaternionCount() != 1)
      return 1;



  ApplicationXimuReader reader;

  std::string file("ximu.dmp");
  std::vector<unsigned char> bytes;

  // read the dump
  std::ifstream binData(file.c_str(), std::ios_base::in | std::ios::binary);
  unsigned char chr = binData.get();

  while (binData.good()) {
    bytes.push_back(chr);
    chr = binData.get();
  }
  size_t numBytes = bytes.size();

  // simulate a port
  std::random_device rdev;
  std::mt19937 rgen(rdev());

  // we are simulating recieving between 2 and a 100 bytes
  std::uniform_int_distribution<int> dist(2, 100);

  auto head = bytes.begin();
  auto tail = bytes.begin();
  while (numBytes > 0) {
    int steps = dist(rgen);
    if (numBytes - steps < bytes.size()) {
      head = tail;
      std::advance(tail, steps);
       numBytes -= steps;
    } else {
      head = tail;
      tail = bytes.end();
      numBytes = 0;
    }
    reader.fill(head, tail);
    reader.read();
  }

  // test the number of packets found
  // packet count has been confirmed with the c# verion.

  if (reader.QuaternionCount() != 565)
    return 1;

  if (reader.CalInertialAndMagneticDataCount() != 2260)
    return 1;
  return 0;
}